

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::RenderImagesList(CEditor *this,CUIRect ToolBox)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  IInput *pIVar4;
  CEditorImage **ppCVar5;
  CLayerGroup **ppCVar6;
  CLayer **ppCVar7;
  CUI *pCVar8;
  IGraphics *pIVar9;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float fVar12;
  float in_XMM1_Db;
  int Result;
  CLayerQuads *pLayer_1;
  CLayerTiles *pLayer;
  int l;
  CLayerGroup *pGroup;
  int g;
  bool Used;
  int i;
  int e;
  float ImageCur;
  float ImageStopAt;
  float ImageStartAt;
  int ScrollNum;
  float ScrollDifference;
  float ImagesHeight;
  float AddButtonHeight;
  float HeaderSeparatorHeight;
  float HeaderHeight;
  float RowHeight;
  CUIRect Slot;
  CLineItem LineItem;
  CUIRect Slot_1;
  CUIRect Scroll;
  char *in_stack_fffffffffffffed8;
  code *pcVar13;
  CUI *in_stack_fffffffffffffee0;
  undefined4 uVar14;
  CUIRect *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  CUI *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  CUIRect *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  uint in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_a4;
  CLayerGroup *in_stack_ffffffffffffff60;
  int local_98;
  int local_90;
  int local_8c;
  float local_88;
  CLineItem local_48;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float fStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fStack_c = in_XMM1_Db;
  iVar2 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                    (&(in_RDI->m_Map).m_lImages);
  fVar10 = (float)iVar2 * 14.0 + 40.0 + 17.0;
  fVar11 = maximum<float>(fVar10 - fStack_c,0.0);
  if (fVar11 <= 0.0) {
    RenderImagesList::s_ScrollValue = 0.0;
  }
  else {
    CUIRect::VSplitRight
              (in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
               (CUIRect *)in_stack_fffffffffffffed8,(CUIRect *)0x1f7390);
    CUIRect::VSplitRight
              (in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
               (CUIRect *)in_stack_fffffffffffffed8,(CUIRect *)0x1f73ac);
    UI(in_RDI);
    RenderImagesList::s_ScrollValue =
         CUI::DoScrollbarV((CUI *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    UI(in_RDI);
    bVar1 = CUI::MouseInside(in_stack_fffffffffffffee0,(CUIRect *)in_stack_fffffffffffffed8);
    if (!bVar1) {
      UI(in_RDI);
      bVar1 = CUI::MouseInside(in_stack_fffffffffffffee0,(CUIRect *)in_stack_fffffffffffffed8);
      if (!bVar1) goto LAB_001f751b;
    }
    iVar2 = (int)((fVar10 - fStack_c) / 14.0) + 1;
    if (0 < iVar2) {
      pIVar4 = Input(in_RDI);
      uVar3 = (*(pIVar4->super_IInterface)._vptr_IInterface[5])(pIVar4,0x1a4,0);
      if ((uVar3 & 1) != 0) {
        RenderImagesList::s_ScrollValue =
             clamp<float>(RenderImagesList::s_ScrollValue - 1.0 / (float)iVar2,0.0,1.0);
      }
      pIVar4 = Input(in_RDI);
      uVar3 = (*(pIVar4->super_IInterface)._vptr_IInterface[5])(pIVar4,0x1a5,0);
      if ((uVar3 & 1) != 0) {
        RenderImagesList::s_ScrollValue =
             clamp<float>(RenderImagesList::s_ScrollValue + 1.0 / (float)iVar2,0.0,1.0);
      }
    }
  }
LAB_001f751b:
  fVar12 = fVar11 * RenderImagesList::s_ScrollValue;
  fVar10 = fVar11 * (RenderImagesList::s_ScrollValue - 1.0) + fVar10;
  local_88 = 0.0;
  for (local_8c = 0; fVar11 = (float)((ulong)in_stack_fffffffffffffee0 >> 0x20), local_8c < 2;
      local_8c = local_8c + 1) {
    if (fVar10 < local_88 + 15.0) goto LAB_001f7cd0;
    if (fVar12 <= local_88) {
      CUIRect::HSplitTop(in_stack_fffffffffffffee8,fVar11,(CUIRect *)in_stack_fffffffffffffed8,
                         (CUIRect *)0x1f75e8);
      UI(in_RDI);
      if (local_8c == 0) {
        in_stack_ffffffffffffff28 = "Embedded";
      }
      else {
        in_stack_ffffffffffffff28 = "External";
      }
      CUI::DoLabel((CUI *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08,
                   (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (float)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef4,SUB41((uint)in_stack_fffffffffffffef0 >> 0x18,0));
    }
    local_88 = local_88 + 15.0;
    local_90 = 0;
    while (in_stack_ffffffffffffff24 = local_90,
          iVar2 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                            (&(in_RDI->m_Map).m_lImages), in_stack_ffffffffffffff24 < iVar2) {
      if (((local_8c == 0) ||
          (ppCVar5 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                               (&(in_RDI->m_Map).m_lImages,local_90), (*ppCVar5)->m_External != 0))
         && ((local_8c != 0 ||
             (ppCVar5 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                                  (&(in_RDI->m_Map).m_lImages,local_90), (*ppCVar5)->m_External == 0
             )))) {
        if (fVar10 < local_88 + 14.0) goto LAB_001f7cd0;
        if (fVar12 <= local_88) {
          local_88 = local_88 + 14.0;
          CUIRect::HSplitTop(in_stack_fffffffffffffee8,
                             (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                             (CUIRect *)in_stack_fffffffffffffed8,(CUIRect *)0x1f7795);
          bVar1 = false;
          local_98 = 0;
          while( true ) {
            in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 & 0xffffff;
            if (!bVar1) {
              in_stack_ffffffffffffff1c = local_98;
              iVar2 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::size
                                (&(in_RDI->m_Map).m_lGroups);
              in_stack_ffffffffffffff20 =
                   CONCAT13(in_stack_ffffffffffffff1c < iVar2,(int3)in_stack_ffffffffffffff20);
            }
            uVar14 = (undefined4)((ulong)in_stack_fffffffffffffee0 >> 0x20);
            if ((char)(in_stack_ffffffffffffff20 >> 0x18) == '\0') break;
            ppCVar6 = array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::operator[]
                                (&(in_RDI->m_Map).m_lGroups,local_98);
            in_stack_ffffffffffffff60 = *ppCVar6;
            local_a4 = 0;
            while( true ) {
              in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 & 0xffffff;
              if (bVar1 == false) {
                in_stack_ffffffffffffff14 = local_a4;
                iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size
                                  (&in_stack_ffffffffffffff60->m_lLayers);
                in_stack_ffffffffffffff18 =
                     CONCAT13(in_stack_ffffffffffffff14 < iVar2,(int3)in_stack_ffffffffffffff18);
              }
              if ((char)(in_stack_ffffffffffffff18 >> 0x18) == '\0') break;
              ppCVar7 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                  (&in_stack_ffffffffffffff60->m_lLayers,local_a4);
              if ((*ppCVar7)->m_Type == 2) {
                ppCVar7 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                    (&in_stack_ffffffffffffff60->m_lLayers,local_a4);
                if (*(int *)&(*ppCVar7)[1].m_pEditor == local_90) {
                  bVar1 = true;
                }
              }
              else {
                ppCVar7 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                    (&in_stack_ffffffffffffff60->m_lLayers,local_a4);
                if (((*ppCVar7)->m_Type == 3) &&
                   (ppCVar7 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                                        (&in_stack_ffffffffffffff60->m_lLayers,local_a4),
                   *(int *)&(*ppCVar7)[1]._vptr_CLayer == local_90)) {
                  bVar1 = true;
                }
              }
              local_a4 = local_a4 + 1;
            }
            local_98 = local_98 + 1;
          }
          in_stack_ffffffffffffff08 =
               (CUIRect *)
               array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                         (&(in_RDI->m_Map).m_lImages,local_90);
          array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                    (&(in_RDI->m_Map).m_lImages,local_90);
          in_stack_fffffffffffffed8 = "Select image";
          in_stack_fffffffffffffee0 = (CUI *)CONCAT44(uVar14,(uint)bVar1);
          in_stack_ffffffffffffff44 =
               DoButton_Image((CEditor *)in_stack_ffffffffffffff28,
                              (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
                              (int)in_stack_ffffffffffffff04,(char *)in_stack_ffffffffffffff60,
                              SUB41((uint)in_stack_ffffffffffffff00 >> 0x18,0));
          if ((in_stack_ffffffffffffff44 != 0) &&
             (in_RDI->m_SelectedImage = local_90, in_stack_ffffffffffffff44 == 2)) {
            in_stack_fffffffffffffef8 = UI(in_RDI);
            uVar14 = (undefined4)((ulong)in_stack_fffffffffffffee0 >> 0x20);
            pCVar8 = UI(in_RDI);
            fVar11 = CUI::MouseX(pCVar8);
            in_stack_ffffffffffffff04 = (float)(int)fVar11;
            pCVar8 = UI(in_RDI);
            CUI::MouseY(pCVar8);
            pcVar13 = PopupImage;
            in_stack_fffffffffffffee0 = (CUI *)CONCAT44(uVar14,0xf);
            CUI::DoPopupMenu((CUI *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                             (int)in_stack_fffffffffffffef8,(int)in_stack_fffffffffffffef4,
                             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             (_func_bool_void_ptr_CUIRect *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff18);
            in_stack_fffffffffffffed8 = (char *)pcVar13;
          }
          CUIRect::HSplitTop(in_stack_fffffffffffffee8,
                             (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                             (CUIRect *)in_stack_fffffffffffffed8,(CUIRect *)0x1f7a9f);
        }
        else {
          local_88 = local_88 + 14.0;
        }
      }
      local_90 = local_90 + 1;
    }
    if (fVar10 < local_88 + 5.0) goto LAB_001f7cd0;
    CUIRect::HSplitTop(in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                       (CUIRect *)in_stack_fffffffffffffed8,(CUIRect *)0x1f7af5);
    local_88 = local_88 + 5.0;
    IGraphics::CLineItem::CLineItem
              (&local_48,local_38,local_34 + local_2c / 2.0,local_38 + local_30,
               local_34 + local_2c / 2.0);
    Graphics(in_RDI);
    IGraphics::TextureClear((IGraphics *)in_stack_fffffffffffffee0);
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x14])();
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x16])(pIVar9,&local_48,1);
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x15])();
  }
  if (local_88 + 17.0 <= fVar10) {
    CUIRect::HSplitTop(in_stack_fffffffffffffee8,fVar11,(CUIRect *)in_stack_fffffffffffffed8,
                       (CUIRect *)0x1f7c32);
    CUIRect::HSplitTop(in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                       (CUIRect *)in_stack_fffffffffffffed8,(CUIRect *)0x1f7c52);
    iVar2 = DoButton_Editor((CEditor *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                            ,(void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (char *)in_stack_ffffffffffffff08,(int)in_stack_ffffffffffffff04,
                            (CUIRect *)in_stack_fffffffffffffef8,(int)in_stack_fffffffffffffef4,
                            (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (iVar2 != 0) {
      InvokeFileDialog((CEditor *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                       (int)in_stack_fffffffffffffef8,
                       (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (char *)in_RDI,(char *)AddImage,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (_func_void_char_ptr_int_void_ptr *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
  }
LAB_001f7cd0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::RenderImagesList(CUIRect ToolBox)
{
	static float s_ScrollValue = 0.0f;
	const float RowHeight = 14.0f;
	const float HeaderHeight = RowHeight + 1.0f;
	const float HeaderSeparatorHeight = 5.0f;
	const float AddButtonHeight = 17.0f;
	const float ImagesHeight = 2 * (HeaderHeight + HeaderSeparatorHeight) + RowHeight * m_Map.m_lImages.size() + AddButtonHeight;
	const float ScrollDifference = maximum(ImagesHeight - ToolBox.h, 0.0f);

	if(ScrollDifference > 0) // Do we even need a scrollbar?
	{
		CUIRect Scroll;
		ToolBox.VSplitRight(15.0f, &ToolBox, &Scroll);
		ToolBox.VSplitRight(3.0f, &ToolBox, 0);	// extra spacing
		s_ScrollValue = UI()->DoScrollbarV(&s_ScrollValue, &Scroll, s_ScrollValue);
		if(UI()->MouseInside(&Scroll) || UI()->MouseInside(&ToolBox))
		{
			int ScrollNum = (int)((ImagesHeight-ToolBox.h)/RowHeight)+1;
			if(ScrollNum > 0)
			{
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_UP))
					s_ScrollValue = clamp(s_ScrollValue - 1.0f/ScrollNum, 0.0f, 1.0f);
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_DOWN))
					s_ScrollValue = clamp(s_ScrollValue + 1.0f/ScrollNum, 0.0f, 1.0f);
			}
		}
	}
	else
		s_ScrollValue = 0.0f;

	const float ImageStartAt = ScrollDifference * s_ScrollValue;
	const float ImageStopAt = ImagesHeight + ScrollDifference * (s_ScrollValue - 1.0f);
	float ImageCur = 0.0f;

	for(int e = 0; e < 2; e++) // two passes, first embedded, then external
	{
		if(ImageCur + HeaderHeight > ImageStopAt)
			return;

		CUIRect Slot;
		if(ImageCur >= ImageStartAt)
		{
			ToolBox.HSplitTop(HeaderHeight, &Slot, &ToolBox);
			UI()->DoLabel(&Slot, e == 0 ? "Embedded" : "External", 12.0f, TEXTALIGN_CENTER);
		}
		ImageCur += HeaderHeight;

		for(int i = 0; i < m_Map.m_lImages.size(); i++)
		{
			if((e && !m_Map.m_lImages[i]->m_External) || (!e && m_Map.m_lImages[i]->m_External))
				continue;

			if(ImageCur + RowHeight > ImageStopAt)
				return;
			else if(ImageCur < ImageStartAt)
			{
				ImageCur += RowHeight;
				continue;
			}
			ImageCur += RowHeight;

			ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);

			// check if images is used
			bool Used = false;
			for(int g = 0; !Used && (g < m_Map.m_lGroups.size()); g++)
			{
				CLayerGroup *pGroup = m_Map.m_lGroups[g];
				for(int l = 0; !Used && l < pGroup->m_lLayers.size(); l++)
				{
					if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
					{
						CLayerTiles *pLayer = static_cast<CLayerTiles *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
					else if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_QUADS)
					{
						CLayerQuads *pLayer = static_cast<CLayerQuads *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
				}
			}

			if(int Result = DoButton_Image(&m_Map.m_lImages[i], m_Map.m_lImages[i]->m_aName, m_SelectedImage == i, &Slot, BUTTON_CONTEXT, "Select image", Used))
			{
				m_SelectedImage = i;

				if(Result == 2)
					UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 80, this, PopupImage);
			}

			ToolBox.HSplitTop(2.0f, 0, &ToolBox);
		}

		// separator
		if(ImageCur + HeaderSeparatorHeight > ImageStopAt)
			return;
		ToolBox.HSplitTop(HeaderSeparatorHeight, &Slot, &ToolBox);
		ImageCur += HeaderSeparatorHeight;
		IGraphics::CLineItem LineItem(Slot.x, Slot.y+Slot.h/2, Slot.x+Slot.w, Slot.y+Slot.h/2);
		Graphics()->TextureClear();
		Graphics()->LinesBegin();
		Graphics()->LinesDraw(&LineItem, 1);
		Graphics()->LinesEnd();
	}

	if(ImageCur + AddButtonHeight > ImageStopAt)
		return;

	// new image
	static int s_NewImageButton = 0;
	CUIRect Slot;
	ToolBox.HSplitTop(5.0f, &Slot, &ToolBox);
	ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);
	if(DoButton_Editor(&s_NewImageButton, "Add", 0, &Slot, 0, "Load a new image to use in the map"))
		InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_IMG, "Add Image", "Add", "mapres", "", AddImage, this);
}